

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

void __thiscall SHA256::transform(SHA256 *this,uchar *message,uint block_nb)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  int aiStack_154 [5];
  uint local_140 [68];
  
  if (0 < (int)block_nb) {
    iVar3 = 0;
    uVar6 = 0;
    do {
      lVar5 = 0;
      do {
        uVar2 = *(uint *)(message + lVar5 * 4 + (long)iVar3);
        local_140[lVar5 + 2] =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar5 = 0x10;
      do {
        uVar2 = local_140[lVar5];
        uVar4 = *(uint *)((long)&local_178 + lVar5 * 4 + 4);
        local_140[lVar5 + 2] =
             (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
             aiStack_154[lVar5] + *(int *)((long)&local_178 + lVar5 * 4) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      local_188 = *(undefined8 *)this->m_h;
      uStack_180 = *(undefined8 *)(this->m_h + 2);
      local_178 = *(undefined8 *)(this->m_h + 4);
      uVar1 = *(undefined8 *)(this->m_h + 6);
      uStack_170 = uVar1;
      uStack_170._4_4_ = (uint)((ulong)uVar1 >> 0x20);
      local_178._4_4_ = (uint)((ulong)local_178 >> 0x20);
      uStack_170._0_4_ = (uint)uVar1;
      local_188._4_4_ = (uint)((ulong)local_188 >> 0x20);
      uStack_180._4_4_ = (uint)((ulong)uStack_180 >> 0x20);
      lVar5 = 0;
      do {
        uVar2 = (uint)uStack_180;
        uStack_180._0_4_ = local_188._4_4_;
        local_188._4_4_ = (uint)local_188;
        uVar4 = (uint)uStack_170;
        uStack_170._0_4_ = local_178._4_4_;
        local_178._4_4_ = (uint)local_178;
        iVar7 = ((local_178._4_4_ << 7 | local_178._4_4_ >> 0x19) ^
                (local_178._4_4_ << 0x15 | local_178._4_4_ >> 0xb) ^
                (local_178._4_4_ << 0x1a | local_178._4_4_ >> 6)) + uStack_170._4_4_ +
                *(int *)((long)sha256_k + lVar5) +
                (((uint)uStack_170 ^ uVar4) & local_178._4_4_ ^ uVar4) +
                *(int *)((long)local_140 + lVar5 + 8);
        local_178._0_4_ = uStack_180._4_4_ + iVar7;
        local_188._0_4_ =
             (uVar2 & (uint)uStack_180 ^ (uVar2 ^ (uint)uStack_180) & local_188._4_4_) +
             ((local_188._4_4_ << 10 | local_188._4_4_ >> 0x16) ^
             (local_188._4_4_ << 0x13 | local_188._4_4_ >> 0xd) ^
             (local_188._4_4_ << 0x1e | local_188._4_4_ >> 2)) + iVar7;
        lVar5 = lVar5 + 4;
        uStack_170._4_4_ = uVar4;
        uStack_180._4_4_ = uVar2;
      } while (lVar5 != 0x100);
      uStack_170 = CONCAT44(uVar4,(uint)uStack_170);
      uStack_180 = CONCAT44(uVar2,(uint)uStack_180);
      lVar5 = 0;
      do {
        this->m_h[lVar5] = this->m_h[lVar5] + *(int *)((long)&local_188 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      uVar6 = uVar6 + 1;
      iVar3 = iVar3 + 0x40;
    } while (uVar6 != block_nb);
  }
  return;
}

Assistant:

void SHA256::transform(const unsigned char *message, unsigned int block_nb)
{
    uint32 w[64];
    uint32 wv[8];
    uint32 t1, t2;
    const unsigned char *sub_block;
    int i;
    int j;
    for (i = 0; i < (int) block_nb; i++) {
        sub_block = message + (i << 6);
        for (j = 0; j < 16; j++) {
            SHA2_PACK32(&sub_block[j << 2], &w[j]);
        }
        for (j = 16; j < 64; j++) {
            w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
        }
        for (j = 0; j < 8; j++) {
            wv[j] = m_h[j];
        }
        for (j = 0; j < 64; j++) {
            t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                + sha256_k[j] + w[j];
            t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
            wv[7] = wv[6];
            wv[6] = wv[5];
            wv[5] = wv[4];
            wv[4] = wv[3] + t1;
            wv[3] = wv[2];
            wv[2] = wv[1];
            wv[1] = wv[0];
            wv[0] = t1 + t2;
        }
        for (j = 0; j < 8; j++) {
            m_h[j] += wv[j];
        }
    }
}